

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O2

Constraint * create_not_equal_to_string_constraint(char *expected_value,char *expected_value_name)

{
  CgreenValue expected_value_00;
  Constraint *pCVar1;
  CgreenValue local_28;
  
  make_cgreen_string_value(&local_28,expected_value);
  expected_value_00.value.integer_value = local_28.value.integer_value;
  expected_value_00.type = local_28.type;
  expected_value_00._4_4_ = local_28._4_4_;
  expected_value_00.value_size = local_28.value_size;
  pCVar1 = create_constraint_expecting(expected_value_00,expected_value_name);
  pCVar1->type = CGREEN_STRING_COMPARER_CONSTRAINT;
  pCVar1->compare = compare_do_not_want_string;
  pCVar1->execute = test_want;
  pCVar1->name = "not equal string";
  pCVar1->destroy = destroy_string_constraint;
  pCVar1->expected_value_message = "\t\texpected to not equal:\t[\"%s\"]";
  return pCVar1;
}

Assistant:

Constraint *create_not_equal_to_string_constraint(const char* expected_value, const char *expected_value_name) {
    Constraint *constraint = create_constraint_expecting(make_cgreen_string_value(expected_value), expected_value_name);
    constraint->type = CGREEN_STRING_COMPARER_CONSTRAINT;

    constraint->compare = &compare_do_not_want_string;
    constraint->execute = &test_want;
    constraint->name = "not equal string";
    constraint->destroy = &destroy_string_constraint;
    constraint->expected_value_message = "\t\texpected to not equal:\t[\"%s\"]";

    return constraint;
}